

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

Argument * __thiscall
argparse::ArgumentParser::operator[](ArgumentParser *this,string_view arg_name)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *this_00;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  logic_error *this_01;
  string prefix;
  string name;
  string_view arg_name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  arg_name_local._M_str = arg_name._M_str;
  arg_name_local._M_len = arg_name._M_len;
  this_00 = &this->m_argument_map;
  cVar2 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
          ::find(&this_00->_M_t,&arg_name_local);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header
     ) {
    return (Argument *)&(cVar2._M_node[1]._M_left)->_M_left;
  }
  bVar1 = is_valid_prefix_char(this,*arg_name_local._M_str);
  if (bVar1) goto LAB_00117239;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&name,&arg_name_local,(allocator<char> *)&prefix);
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,'\x01');
  std::operator+(&local_48,&prefix,&name);
  std::__cxx11::string::operator=((string *)&name,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_48._M_dataplus._M_p = (pointer)name._M_string_length;
  local_48._M_string_length = (size_type)name._M_dataplus._M_p;
  cVar3 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_48);
  if (cVar3._M_node == cVar2._M_node) {
    std::operator+(&local_48,&prefix,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    local_48._M_dataplus._M_p = (pointer)name._M_string_length;
    local_48._M_string_length = (size_type)name._M_dataplus._M_p;
    cVar3 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
            ::find(&this_00->_M_t,(key_type *)&local_48);
    if (cVar3._M_node != cVar2._M_node) goto LAB_00117203;
    bVar1 = true;
  }
  else {
LAB_00117203:
    cVar2._M_node = (_Base_ptr)&(cVar3._M_node[1]._M_left)->_M_left;
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&name);
  if (!bVar1) {
    return (Argument *)cVar2._M_node;
  }
LAB_00117239:
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&prefix,&arg_name_local,(allocator<char> *)&local_48);
  std::operator+(&name,"No such argument: ",&prefix);
  std::logic_error::logic_error(this_01,(string *)&name);
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Argument &operator[](std::string_view arg_name) const {
    auto it = m_argument_map.find(arg_name);
    if (it != m_argument_map.end()) {
      return *(it->second);
    }
    if (!is_valid_prefix_char(arg_name.front())) {
      std::string name(arg_name);
      const auto legal_prefix_char = get_any_valid_prefix_char();
      const auto prefix = std::string(1, legal_prefix_char);

      // "-" + arg_name
      name = prefix + name;
      it = m_argument_map.find(name);
      if (it != m_argument_map.end()) {
        return *(it->second);
      }
      // "--" + arg_name
      name = prefix + name;
      it = m_argument_map.find(name);
      if (it != m_argument_map.end()) {
        return *(it->second);
      }
    }
    throw std::logic_error("No such argument: " + std::string(arg_name));
  }